

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

Reflection * google::protobuf::internal::GetReflectionOrDie(Message *m)

{
  LogMessage *pLVar1;
  Metadata MVar2;
  allocator<char> local_41;
  LogMessageFatal local_40 [16];
  string local_30 [32];
  
  MVar2 = Message::GetMetadata(m);
  if (MVar2.reflection != (Reflection *)0x0) {
    return MVar2.reflection;
  }
  MVar2 = Message::GetMetadata(m);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/reflection_ops.cc"
             ,0x25);
  pLVar1 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     ((LogMessage *)local_40,
                      (char (*) [43])"Message does not support reflection (type ");
  if (MVar2.descriptor == (Descriptor *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"unknown",&local_41);
  }
  else {
    std::__cxx11::string::string(local_30,(string *)(MVar2.descriptor)->all_names_);
  }
  pLVar1 = (LogMessage *)absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,local_30);
  absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar1,(char (*) [3])0x2fb1b4);
  std::__cxx11::string::~string(local_30);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

static const Reflection* GetReflectionOrDie(const Message& m) {
  const Reflection* r = m.GetReflection();
  if (r == nullptr) {
    const Descriptor* d = m.GetDescriptor();
    // RawMessage is one known type for which GetReflection() returns nullptr.
    ABSL_LOG(FATAL) << "Message does not support reflection (type "
                    << (d ? d->name() : "unknown") << ").";
  }
  return r;
}